

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

string * __thiscall Tokenizer::readRelOp_abi_cxx11_(string *__return_storage_ptr__,Tokenizer *this)

{
  bool bVar1;
  byte bVar2;
  long *plVar3;
  ulong uVar4;
  char local_1a;
  char c;
  Tokenizer *this_local;
  string *op;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    plVar3 = (long *)std::istream::get((char *)this->inStream);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar1 || local_1a == ' ') break;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_1a);
  }
  uVar4 = std::__cxx11::string::length();
  if (uVar4 < 3) {
    bVar2 = std::ios::good();
    if ((bVar2 & 1) != 0) {
      std::istream::putback((char)this->inStream);
    }
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"Invalid Operator.\n");
  exit(1);
}

Assistant:

std::string Tokenizer::readRelOp(){
    std::string op;
    char c;
    while(inStream.get(c) && c != ' '){
        op += c;
    }
    if(op.length() > 2) {
        std::cout << "Invalid Operator.\n";
        exit(1);
    }
    if(inStream.good())  // In the loop, we have read one char too many.
        inStream.putback(c);
    return op;
}